

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlChar * xmlNodeGetBase(xmlDoc *doc,xmlNode *cur)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  long lVar5;
  xmlNode *node;
  xmlEntityPtr ent;
  
  if ((doc != (xmlDoc *)0x0 || cur != (xmlNode *)0x0) &&
     ((cur == (xmlNode *)0x0 || (cur->type != XML_NAMESPACE_DECL)))) {
    if (doc == (xmlDoc *)0x0) {
      doc = cur->doc;
    }
    if ((doc == (_xmlDoc *)0x0) || (doc->type != XML_HTML_DOCUMENT_NODE)) {
      if (cur == (xmlNode *)0x0) {
        pxVar4 = (xmlChar *)0x0;
      }
      else {
        pxVar4 = (xmlChar *)0x0;
        do {
          if (cur->type == XML_ELEMENT_NODE) {
            pxVar3 = xmlGetNsProp(cur,"base",(xmlChar *)"http://www.w3.org/XML/1998/namespace");
            if (pxVar3 != (xmlChar *)0x0) {
              if (pxVar4 != (xmlChar *)0x0) {
                pxVar2 = xmlBuildURI(pxVar4,pxVar3);
                (*xmlFree)(pxVar4);
                (*xmlFree)(pxVar3);
                pxVar3 = pxVar2;
                if (pxVar2 == (xmlChar *)0x0) {
                  return (xmlChar *)0x0;
                }
              }
              iVar1 = xmlStrncmp(pxVar3,(xmlChar *)"http://",7);
              if (iVar1 == 0) {
                return pxVar3;
              }
              iVar1 = xmlStrncmp(pxVar3,(xmlChar *)"ftp://",6);
              if (iVar1 == 0) {
                return pxVar3;
              }
              iVar1 = xmlStrncmp(pxVar3,(xmlChar *)"urn:",4);
              pxVar4 = pxVar3;
              if (iVar1 == 0) {
                return pxVar3;
              }
            }
          }
          else if (cur->type == XML_ENTITY_DECL) {
            pxVar3 = (xmlChar *)cur[1]._private;
            goto LAB_00186f01;
          }
          cur = cur->parent;
        } while (cur != (_xmlNode *)0x0);
      }
      if (doc == (_xmlDoc *)0x0) {
        return pxVar4;
      }
      pxVar3 = doc->URL;
      if (pxVar3 == (xmlChar *)0x0) {
        return pxVar4;
      }
      if (pxVar4 != (xmlChar *)0x0) {
        pxVar3 = xmlBuildURI(pxVar4,pxVar3);
        (*xmlFree)(pxVar4);
        return pxVar3;
      }
LAB_00186f01:
      pxVar4 = xmlStrdup(pxVar3);
      return pxVar4;
    }
    node = doc->children;
    if (node != (_xmlNode *)0x0) {
      do {
        if (node->name == (xmlChar *)0x0) {
          return (xmlChar *)0x0;
        }
        lVar5 = 0x30;
        if (node->type == XML_ELEMENT_NODE) {
          iVar1 = xmlStrcasecmp(node->name,"html");
          lVar5 = 0x18;
          if ((iVar1 != 0) && (iVar1 = xmlStrcasecmp(node->name,"head"), iVar1 != 0)) {
            iVar1 = xmlStrcasecmp(node->name,"base");
            lVar5 = 0x30;
            if (iVar1 == 0) {
              pxVar4 = xmlGetProp(node,"href");
              return pxVar4;
            }
          }
        }
        node = *(xmlNode **)((long)&node->_private + lVar5);
      } while (node != (xmlNode *)0x0);
      return (xmlChar *)0x0;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlNodeGetBase(const xmlDoc *doc, const xmlNode *cur) {
    xmlChar *oldbase = NULL;
    xmlChar *base, *newbase;

    if ((cur == NULL) && (doc == NULL))
        return(NULL);
    if ((cur != NULL) && (cur->type == XML_NAMESPACE_DECL))
        return(NULL);
    if (doc == NULL) doc = cur->doc;
    if ((doc != NULL) && (doc->type == XML_HTML_DOCUMENT_NODE)) {
        cur = doc->children;
	while ((cur != NULL) && (cur->name != NULL)) {
	    if (cur->type != XML_ELEMENT_NODE) {
	        cur = cur->next;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "html")) {
	        cur = cur->children;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "head")) {
	        cur = cur->children;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "base")) {
                return(xmlGetProp(cur, BAD_CAST "href"));
	    }
	    cur = cur->next;
	}
	return(NULL);
    }
    while (cur != NULL) {
	if (cur->type == XML_ENTITY_DECL) {
	    xmlEntityPtr ent = (xmlEntityPtr) cur;
	    return(xmlStrdup(ent->URI));
	}
	if (cur->type == XML_ELEMENT_NODE) {
	    base = xmlGetNsProp(cur, BAD_CAST "base", XML_XML_NAMESPACE);
	    if (base != NULL) {
		if (oldbase != NULL) {
		    newbase = xmlBuildURI(oldbase, base);
		    if (newbase != NULL) {
			xmlFree(oldbase);
			xmlFree(base);
			oldbase = newbase;
		    } else {
			xmlFree(oldbase);
			xmlFree(base);
			return(NULL);
		    }
		} else {
		    oldbase = base;
		}
		if ((!xmlStrncmp(oldbase, BAD_CAST "http://", 7)) ||
		    (!xmlStrncmp(oldbase, BAD_CAST "ftp://", 6)) ||
		    (!xmlStrncmp(oldbase, BAD_CAST "urn:", 4)))
		    return(oldbase);
	    }
	}
	cur = cur->parent;
    }
    if ((doc != NULL) && (doc->URL != NULL)) {
	if (oldbase == NULL)
	    return(xmlStrdup(doc->URL));
	newbase = xmlBuildURI(oldbase, doc->URL);
	xmlFree(oldbase);
	return(newbase);
    }
    return(oldbase);
}